

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O3

int Abc_NtkHaigResetReprs(Hop_Man_t *p)

{
  undefined8 *puVar1;
  long *plVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  long lVar5;
  undefined8 *puVar6;
  int iVar7;
  
  pHVar4 = (Hop_Obj_t *)p->vObjs;
  if (0 < *(int *)((long)&pHVar4->field_0 + 4)) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)(&((pHVar4->field_1).pNext)->field_0)[lVar5].pData;
      puVar6 = (undefined8 *)*puVar1;
      if (puVar6 == (undefined8 *)0x0) {
        puVar6 = (undefined8 *)0x0;
      }
      else if ((undefined8 *)*puVar6 == puVar1) {
        *puVar6 = puVar6;
        puVar6 = (undefined8 *)*puVar1;
      }
      if (puVar6 == puVar1) {
        *puVar1 = 0;
      }
      lVar5 = lVar5 + 1;
      pHVar4 = (Hop_Obj_t *)p->vObjs;
      iVar7 = *(int *)((long)&pHVar4->field_0 + 4);
    } while (lVar5 < iVar7);
    if (0 < iVar7) {
      lVar5 = 0;
      do {
        plVar2 = (long *)(&((pHVar4->field_1).pNext)->field_0)[lVar5].pData;
        if (*plVar2 != 0) {
          pHVar4 = Hop_ObjRepr(pHVar4);
          (pHVar4->field_0).pData = pHVar4;
          *plVar2 = (long)pHVar4;
          pHVar4 = (Hop_Obj_t *)p->vObjs;
        }
        lVar5 = lVar5 + 1;
        iVar7 = *(int *)((long)&pHVar4->field_0 + 4);
      } while (lVar5 < iVar7);
      if (0 < iVar7) {
        lVar5 = 0;
        do {
          pHVar3 = (Hop_Obj_t *)(&((pHVar4->field_1).pNext)->field_0)[lVar5].pData;
          if ((pHVar3->field_0).pData != (void *)0x0) {
            pHVar4 = Hop_ObjRepr((pHVar4->field_1).pNext);
            if (pHVar3->Id < pHVar4->Id) {
              (pHVar4->field_0).pData = pHVar3;
              pHVar4 = pHVar3;
            }
            (pHVar3->field_0).pData = pHVar4;
          }
          lVar5 = lVar5 + 1;
          pHVar4 = (Hop_Obj_t *)p->vObjs;
          iVar7 = *(int *)((long)&pHVar4->field_0 + 4);
        } while (lVar5 < iVar7);
        if (0 < iVar7) {
          lVar5 = 0;
          iVar7 = 0;
          do {
            plVar2 = (long *)(&((pHVar4->field_1).pNext)->field_0)[lVar5].pData;
            if ((long *)*plVar2 != (long *)0x0) {
              if ((long *)*plVar2 != plVar2) {
                iVar7 = (iVar7 + 1) - (uint)(*(uint *)(plVar2 + 4) < 0x40);
              }
              pHVar4 = Hop_ObjRepr(pHVar4);
              if ((Hop_Obj_t *)*plVar2 != pHVar4) {
                __assert_fail("pObj->pData == pRepr",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                              ,0x202,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
              }
              if (*(int *)((long)plVar2 + 0x24) < pHVar4->Id) {
                __assert_fail("pRepr->Id <= pObj->Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                              ,0x203,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
              }
              pHVar4 = (Hop_Obj_t *)p->vObjs;
            }
            lVar5 = lVar5 + 1;
            if (*(int *)((long)&pHVar4->field_0 + 4) <= lVar5) {
              return iVar7;
            }
          } while( true );
        }
      }
    }
  }
  return 0;
}

Assistant:

int Abc_NtkHaigResetReprs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pRepr;
    int i, nClasses, nMembers, nFanouts, nNormals;
    // clear self-classes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // fix the strange situation of double-loop
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( pRepr && pRepr->pData == pObj )
            pRepr->pData = pRepr;
        // remove self-loops
        if ( pObj->pData == pObj )
            pObj->pData = NULL;
    }
    // set representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // get representative of the node
        pRepr = Hop_ObjRepr( pObj );
        pRepr->pData = pRepr;
        // set the representative
        pObj->pData = pRepr;
    }
    // make each class point to the smallest topological order
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pRepr = Hop_ObjRepr( pObj );
        if ( pRepr->Id > pObj->Id )
        {
            pRepr->pData = pObj;
            pObj->pData = pObj;
        }
        else
            pObj->pData = pRepr;
    }
    // count classes, members, and fanouts - and verify
    nMembers = nClasses = nFanouts = nNormals = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // count members
        nMembers++;
        // count the classes and fanouts
        if ( pObj->pData == pObj )
            nClasses++;
        else if ( Hop_ObjRefs(pObj) > 0 )
            nFanouts++;
        else
            nNormals++;
        // compare representatives
        pRepr = Hop_ObjRepr( pObj );
        assert( pObj->pData == pRepr );
        assert( pRepr->Id <= pObj->Id );
    }
//    printf( "Nodes = %7d.  Member = %7d.  Classes = %6d.  Fanouts = %6d.  Normals = %6d.\n", 
//        Hop_ManNodeNum(p), nMembers, nClasses, nFanouts, nNormals );
    return nFanouts;
}